

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_ping.c
# Opt level: O1

ssize_t tnt_ping(tnt_stream *s)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ssize_t sVar4;
  long lVar5;
  undefined1 local_78 [8];
  iovec v [3];
  tnt_iheader hdr;
  undefined1 local_13 [2];
  undefined1 local_11;
  undefined1 auStack_10 [5];
  char body [2];
  char len_prefix [9];
  
  uVar3 = s->reqid;
  s->reqid = uVar3 + 1;
  v[2].iov_len._5_1_ = '\0';
  v[2].iov_len._6_1_ = '\0';
  v[2].iov_len._7_1_ = '\0';
  hdr.header[0] = '\0';
  hdr.header[1] = '\0';
  hdr.header[2] = '\0';
  hdr.header[3] = '\0';
  hdr.header[4] = '\0';
  hdr.header[5] = '\0';
  hdr.header[6] = '\0';
  hdr.header[7] = '\0';
  hdr.header[8] = '\0';
  hdr.header[9] = '\0';
  hdr.header[10] = '\0';
  hdr.header[0xb] = '\0';
  hdr.header[0xc] = '\0';
  hdr.header[0xd] = '\0';
  hdr.header[0xe] = '\0';
  hdr.header[0xf] = '\0';
  hdr.header[0x10] = '\0';
  hdr.header[0x11] = '\0';
  hdr.header[0x12] = '\0';
  hdr.header[0x13] = '\0';
  hdr.header[0x14] = '\0';
  hdr.header[0x15] = '\0';
  hdr.header[0x16] = '\0';
  hdr.header[0x17] = '\0';
  v[2].iov_len._0_4_ = 0x1400082;
  cVar1 = (char)uVar3;
  if (uVar3 < 0x80) {
    hdr._24_8_ = (long)&v[2].iov_len + 5;
    v[2].iov_len._4_1_ = cVar1;
    v[1].iov_base = (void *)0x5;
  }
  else if (uVar3 < 0x100) {
    hdr._24_8_ = (long)&v[2].iov_len + 6;
    v[2].iov_len._4_1_ = -0x34;
    v[2].iov_len._5_1_ = cVar1;
    v[1].iov_base = (void *)0x6;
  }
  else {
    v[2].iov_len._5_1_ = (char)(uVar3 >> 8);
    if (uVar3 < 0x10000) {
      hdr._24_8_ = (long)&v[2].iov_len + 7;
      v[2].iov_len._4_1_ = -0x33;
      v[1].iov_base = (void *)0x7;
      v[2].iov_len._6_1_ = cVar1;
    }
    else if (uVar3 >> 0x20 == 0) {
      hdr._24_8_ = hdr.header + 1;
      v[2].iov_len._4_1_ = -0x32;
      v[2].iov_len._6_1_ = (char)(uVar3 >> 0x10);
      v[2].iov_len._7_1_ = v[2].iov_len._5_1_;
      v[2].iov_len._5_1_ = (char)(uVar3 >> 0x18);
      v[1].iov_base = (void *)0x9;
      hdr.header[0] = cVar1;
    }
    else {
      hdr._24_8_ = hdr.header + 5;
      v[2].iov_len._4_1_ = -0x31;
      v[2].iov_len._6_1_ = (char)(uVar3 >> 0x30);
      v[2].iov_len._7_1_ = (char)(uVar3 >> 0x28);
      hdr.header[0] = (char)(uVar3 >> 0x20);
      hdr.header._1_4_ =
           (uint)(uVar3 >> 0x18) & 0xff | (uint)(uVar3 >> 8) & 0xff00 |
           (uint)(((uVar3 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar3 << 0x38) >> 0x20);
      v[2].iov_len._5_1_ = (char)(uVar3 >> 0x38);
      v[1].iov_base = (void *)0xd;
    }
  }
  v[0].iov_len = (size_t)&v[2].iov_len;
  local_13[0] = 0x80;
  v[1].iov_len = (size_t)local_13;
  v[2].iov_base = (void *)0x1;
  lVar5 = 0x18;
  uVar3 = 0;
  do {
    uVar3 = uVar3 + *(long *)((long)v + lVar5 + -8);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x38);
  if (uVar3 >> 0x20 == 0) {
    local_11 = 0xce;
    uVar2 = (uint)uVar3;
    _auStack_10 = CONCAT44(stack0xfffffffffffffff4,
                           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18);
    v[0].iov_base = (void *)0x5;
  }
  else {
    local_11 = 0xcf;
    _auStack_10 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                  | uVar3 << 0x38;
    v[0].iov_base = (void *)0x9;
  }
  local_78 = (undefined1  [8])&local_11;
  sVar4 = (*s->writev)(s,(iovec *)local_78,3);
  return sVar4;
}

Assistant:

ssize_t
tnt_ping(struct tnt_stream *s)
{
	struct tnt_iheader hdr;
	struct iovec v[3]; int v_sz = 3;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_PING, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[2]; data = body;

	data = mp_encode_map(data, 0);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}